

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O3

bool __thiscall
dap::Deserializer::
deserialize<std::vector<dap::SourceBreakpoint,std::allocator<dap::SourceBreakpoint>>>
          (Deserializer *this,
          optional<std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>_> *opt
          )

{
  int iVar1;
  undefined4 extraout_var;
  vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_> v;
  size_t i;
  vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_> *local_60;
  vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_> local_58;
  undefined8 **local_40;
  undefined8 *local_38;
  code *local_30;
  code *local_28;
  undefined8 local_20;
  
  local_60 = &local_58;
  local_58.super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*this->_vptr_Deserializer[8])();
  std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>::resize
            (&local_58,CONCAT44(extraout_var,iVar1));
  local_38 = &local_20;
  local_20 = 0;
  local_40 = (undefined8 **)&local_60;
  local_28 = std::
             _Function_handler<bool_(dap::Deserializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/serialization.h:98:14)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<bool_(dap::Deserializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/serialization.h:98:14)>
             ::_M_manager;
  iVar1 = (*this->_vptr_Deserializer[9])(this);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,3);
  }
  if ((char)iVar1 != '\0') {
    std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>::operator=
              (&opt->val,&local_58);
    opt->set = true;
  }
  std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>::~vector(&local_58);
  return true;
}

Assistant:

bool Deserializer::deserialize(dap::optional<T>* opt) const {
  T v;
  if (deserialize(&v)) {
    *opt = v;
  }
  return true;
}